

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
efsw::FileWatcherGeneric::directories_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FileWatcherGeneric *this)

{
  bool bVar1;
  size_type __n;
  reference ppWVar2;
  __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
  local_48;
  __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
  local_40;
  iterator it;
  Lock local_28;
  Lock lock;
  FileWatcherGeneric *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs;
  
  lock.mMutex._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  Lock::Lock(&local_28,&this->mWatchesLock);
  __n = std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::size
                  (&this->mWatches);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,__n);
  local_40._M_current =
       (WatcherGeneric **)
       std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::begin
                 (&this->mWatches);
  while( true ) {
    local_48._M_current =
         (WatcherGeneric **)
         std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::end
                   (&this->mWatches);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppWVar2 = __gnu_cxx::
              __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
              ::operator*(&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&((*ppWVar2)->super_Watcher).Directory);
    __gnu_cxx::
    __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
    ::operator++(&local_40);
  }
  lock.mMutex._7_1_ = 1;
  Lock::~Lock(&local_28);
  if ((lock.mMutex._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> FileWatcherGeneric::directories() {
	std::vector<std::string> dirs;

	Lock lock( mWatchesLock );

	dirs.reserve( mWatches.size() );

	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); ++it ) {
		dirs.push_back( ( *it )->Directory );
	}

	return dirs;
}